

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O1

void __thiscall t_xml_generator::write_const_value(t_xml_generator *this,t_const_value *value)

{
  int *piVar1;
  pointer pcVar2;
  t_const_value_type tVar3;
  int64_t n;
  ostream *poVar4;
  _Base_ptr p_Var5;
  undefined1 auVar6 [8];
  char *__end;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> list;
  undefined1 local_1a0 [8];
  _Rb_tree_node_base local_198;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tVar3 = t_const_value::get_type(value);
  switch(tVar3) {
  case CV_INTEGER:
  case CV_IDENTIFIER:
    paVar7 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"int","");
    n = t_const_value::get_integer(value);
    write_element_number<long>(this,&local_b0,n);
    local_1a0 = (undefined1  [8])local_b0._M_dataplus._M_p;
    break;
  case CV_DOUBLE:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"double","");
    write_element_number<double>(this,&local_50,value->doubleVal_);
    local_1a0 = (undefined1  [8])local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
    goto LAB_00366f3f;
  case CV_STRING:
    paVar7 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"string","");
    pcVar2 = (value->stringVal_)._M_dataplus._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + (value->stringVal_)._M_string_length);
    write_element_string(this,&local_d0,&local_f0);
    local_1a0 = (undefined1  [8])local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
      local_1a0 = (undefined1  [8])local_d0._M_dataplus._M_p;
    }
    break;
  case CV_MAP:
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"map","");
    write_element_start(this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::_Rb_tree((_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)local_1a0,
               (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)value);
    if (local_198._M_left != &local_198) {
      p_Var5 = local_198._M_left;
      do {
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"entry","");
        write_element_start(this,&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"key","");
        write_element_start(this,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        write_const_value(this,*(t_const_value **)(p_Var5 + 1));
        write_element_end(this);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"value","");
        write_element_start(this,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        write_const_value(this,(t_const_value *)p_Var5[1]._M_parent);
        write_element_end(this);
        write_element_end(this);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != &local_198);
    }
    write_element_end(this);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~_Rb_tree((_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 *)local_1a0);
    return;
  case CV_LIST:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"list","");
    write_element_start(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
              ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)local_1a0,
               &value->listVal_);
    if (local_1a0 != (undefined1  [8])local_198._0_8_) {
      auVar6 = local_1a0;
      do {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"entry","");
        write_element_start(this,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        write_const_value(this,*(t_const_value **)auVar6);
        write_element_end(this);
        auVar6 = (undefined1  [8])((long)auVar6 + 8);
      } while (auVar6 != (undefined1  [8])local_198._0_8_);
    }
    write_element_end(this);
    if (local_1a0 == (undefined1  [8])0x0) {
      return;
    }
    goto LAB_00366f3f;
  default:
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_((string *)local_1a0,&this->super_t_generator);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->f_xml_,(char *)local_1a0,local_198._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<null />",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_1a0 != (undefined1  [8])&local_198._M_parent) {
      operator_delete((void *)local_1a0);
    }
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    return;
  }
  if (local_1a0 == (undefined1  [8])paVar7) {
    return;
  }
LAB_00366f3f:
  operator_delete((void *)local_1a0);
  return;
}

Assistant:

void t_xml_generator::write_const_value(t_const_value* value) {

  switch (value->get_type()) {

  case t_const_value::CV_IDENTIFIER:
  case t_const_value::CV_INTEGER:
    write_element_number("int", value->get_integer());
    break;

  case t_const_value::CV_DOUBLE:
    write_element_number("double", value->get_double());
    break;

  case t_const_value::CV_STRING:
    write_element_string("string", value->get_string());
    break;

  case t_const_value::CV_LIST: {
    write_element_start("list");
    std::vector<t_const_value*> list = value->get_list();
    std::vector<t_const_value*>::iterator lit;
    for (lit = list.begin(); lit != list.end(); ++lit) {
      write_element_start("entry");
      write_const_value(*lit);
      write_element_end();
    }
    write_element_end();
    break;
  }

  case t_const_value::CV_MAP: {
    write_element_start("map");
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare> map = value->get_map();
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::iterator mit;
    for (mit = map.begin(); mit != map.end(); ++mit) {
      write_element_start("entry");
      write_element_start("key");
      write_const_value(mit->first);
      write_element_end();
      write_element_start("value");
      write_const_value(mit->second);
      write_element_end();
      write_element_end();
    }
    write_element_end();
    break;
  }

  default:
    indent_up();
    f_xml_ << indent() << "<null />" << endl;
    indent_down();
    break;
  }

}